

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_ext_pre_shared_key_parse_serverhello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  int iVar1;
  size_t sVar2;
  uint16_t local_2a;
  CBS *pCStack_28;
  uint16_t psk_id;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  pCStack_28 = contents;
  contents_local = (CBS *)out_alert;
  out_alert_local = (uint8_t *)hs;
  iVar1 = CBS_get_u16(contents,&local_2a);
  if ((iVar1 != 0) && (sVar2 = CBS_len(pCStack_28), sVar2 == 0)) {
    if (local_2a != 0) {
      ERR_put_error(0x10,0,0xc3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x79f);
      *(undefined1 *)&contents_local->data = 0x73;
      return false;
    }
    return true;
  }
  ERR_put_error(0x10,0,0x89,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,0x798);
  *(undefined1 *)&contents_local->data = 0x32;
  return false;
}

Assistant:

bool ssl_ext_pre_shared_key_parse_serverhello(SSL_HANDSHAKE *hs,
                                              uint8_t *out_alert,
                                              CBS *contents) {
  uint16_t psk_id;
  if (!CBS_get_u16(contents, &psk_id) ||  //
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_DECODE_ERROR;
    return false;
  }

  // We only advertise one PSK identity, so the only legal index is zero.
  if (psk_id != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PSK_IDENTITY_NOT_FOUND);
    *out_alert = SSL_AD_UNKNOWN_PSK_IDENTITY;
    return false;
  }

  return true;
}